

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O1

lua_Unsigned andaux(lua_State *L)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  lua_Unsigned lVar4;
  int arg;
  ulong uVar5;
  
  iVar2 = lua_gettop(L);
  if (iVar2 < 1) {
    lVar4 = 0xffffffff;
  }
  else {
    arg = 1;
    uVar5 = 0xffffffffffffffff;
    do {
      uVar3 = luaL_checkinteger(L,arg);
      uVar5 = uVar5 & uVar3;
      iVar1 = (1 - iVar2) + arg;
      arg = arg + 1;
    } while (iVar1 != 1);
    lVar4 = uVar5 & 0xffffffff;
  }
  return lVar4;
}

Assistant:

static lua_Unsigned andaux (lua_State *L) {
  int i, n = lua_gettop(L);
  lua_Unsigned r = ~(lua_Unsigned)0;
  for (i = 1; i <= n; i++)
    r &= checkunsigned(L, i);
  return trim(r);
}